

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O0

uint32_t FACT3DApply(F3DAUDIO_DSP_SETTINGS *pDSPSettings,FACTCue *pCue)

{
  FACTCue *in_RSI;
  long in_RDI;
  float *in_stack_ffffffffffffffd0;
  FACTCue *in_stack_ffffffffffffffd8;
  FACTCue *pCue_00;
  FACTCue *in_stack_ffffffffffffffe0;
  FACTCue *pCue_01;
  FACTCue *pCue_02;
  
  if ((in_RDI != 0) && (in_RSI != (FACTCue *)0x0)) {
    FACTCue_SetMatrixCoefficients
              (in_stack_ffffffffffffffe0,(uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    pCue_00 = in_RSI;
    FACTCue_GetVariableIndex(in_stack_ffffffffffffffd8,(char *)in_RSI);
    FACTCue_SetVariable(pCue_00,(uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30),
                        SUB84(in_stack_ffffffffffffffe0,0));
    pCue_01 = pCue_00;
    FACTCue_GetVariableIndex(pCue_00,(char *)in_RSI);
    FACTCue_SetVariable(pCue_01,(uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30),
                        SUB84(in_stack_ffffffffffffffe0,0));
    pCue_02 = pCue_01;
    FACTCue_GetVariableIndex(pCue_00,(char *)in_RSI);
    FACTCue_SetVariable(pCue_02,(uint16_t)((ulong)pCue_01 >> 0x30),SUB84(pCue_01,0));
  }
  return 0;
}

Assistant:

uint32_t FACT3DApply(
	F3DAUDIO_DSP_SETTINGS *pDSPSettings,
	FACTCue *pCue
) {
	if (pDSPSettings == NULL || pCue == NULL)
	{
		return 0;
	}

	FACTCue_SetMatrixCoefficients(
		pCue,
		pDSPSettings->SrcChannelCount,
		pDSPSettings->DstChannelCount,
		pDSPSettings->pMatrixCoefficients
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "Distance"),
		pDSPSettings->EmitterToListenerDistance
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "DopplerPitchScalar"),
		pDSPSettings->DopplerFactor
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "OrientationAngle"),
		pDSPSettings->EmitterToListenerAngle * (180.0f / F3DAUDIO_PI)
	);
	return 0;
}